

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  bool bVar1;
  type_conflict *ptVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_10 = local_38;
  local_8 = local_38;
  local_28 = 0;
  if (in_RSI != in_RDI) {
    move<std::vector<unsigned_long,std::allocator<unsigned_long>>&>(&in_RSI->m_bits);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ptVar2 = move<unsigned_long&>(&in_RSI->m_num_bits);
    in_RDI->m_num_bits = *ptVar2;
    memset(&stack0xffffffffffffff98,0,0x18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cb7e8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_ffffffffffffffa0);
    if (!bVar1) {
      __assert_fail("(b.m_bits = buffer_type()).empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x2a2,
                    "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffa0);
    in_RSI->m_num_bits = 0;
  }
  return in_RDI;
}

Assistant:

inline dynamic_bitset<Block, Allocator>& dynamic_bitset<Block, Allocator>::
operator=(dynamic_bitset<Block, Allocator>&& b)
{
    if (boost::addressof(b) == this) { return *this; }

    m_bits = boost::move(b.m_bits);
    m_num_bits = boost::move(b.m_num_bits);
    // Required so that assert(m_check_invariants()); works.
    assert((b.m_bits = buffer_type()).empty());
    b.m_num_bits = 0;
    return *this;
}